

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O1

size_t __thiscall Potassco::EnumClass::convert(EnumClass *this,char *x,int *out)

{
  char *pcVar1;
  bool bVar2;
  size_t sVar3;
  longlong temp;
  StringSpan k;
  int local_40 [2];
  StringSpan local_38;
  
  local_38.first = x;
  bVar2 = parseSigned(&local_38.first,(longlong *)local_40,-0x80000000,0x7fffffff);
  pcVar1 = local_38.first;
  if ((bVar2) && (bVar2 = isValid(this,local_40[0]), bVar2)) {
    *out = local_40[0];
    return (long)pcVar1 - (long)x;
  }
  if (pcVar1 == x) {
    local_38.size = strcspn(x," ,=");
    local_38.first = x;
    bVar2 = detail::find_kv(this,&local_38,(int *)0x0,(StringSpan *)0x0,out);
    sVar3 = 0;
    if (bVar2) {
      sVar3 = local_38.size;
    }
  }
  else {
    sVar3 = 0;
  }
  return sVar3;
}

Assistant:

size_t EnumClass::convert(const char* x, int& out) const {
	int cVal; const char* next;
	if (xconvert(x, cVal, &next, ',') && isValid(cVal)) {
		out = cVal;
		return static_cast<size_t>(next - x);
	}
	else if (x == next) {
		StringSpan k = toSpan(x, std::strcspn(x, " ,="));
		return detail::find_kv(*this, &k, 0, 0, &out) ? k.size : 0;
	}
	else { return static_cast<size_t>(0); }
}